

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

uint32_t ircode_register_pop_context_protect(ircode_t *code,_Bool protect)

{
  size_t sVar1;
  _Bool *context;
  uint32_t value;
  _Bool protect_local;
  ircode_t *code_local;
  
  if ((code->registers).n == 0) {
    code_local._4_4_ = 0xffffffff;
  }
  else {
    sVar1 = (code->registers).n;
    (code->registers).n = sVar1 - 1;
    code_local._4_4_ = (code->registers).p[sVar1 - 1];
    if (protect) {
      code->state[code_local._4_4_] = true;
    }
    else if (code->nlocals <= code_local._4_4_) {
      code->state[code_local._4_4_] = false;
    }
    if ((protect) && (code->nlocals <= code_local._4_4_)) {
      (code->context).p[(code->context).n - 1][code_local._4_4_] = true;
    }
  }
  return code_local._4_4_;
}

Assistant:

uint32_t ircode_register_pop_context_protect (ircode_t *code, bool protect) {
    if (marray_size(code->registers) == 0) return REGISTER_ERROR;
    uint32_t value = (uint32_t)marray_pop(code->registers);

    if (protect) code->state[value] = true;
    else if (value >= code->nlocals) code->state[value] = false;

    if (protect && value >= code->nlocals) {
        bool *context = marray_last(code->context);
        context[value] = true;
    }

    DEBUG_REGISTER("POP REGISTER %d", value);
    return value;
}